

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O1

Vec_Vec_t * Nwk_ManLevelize(Nwk_Man_t *pNtk)

{
  void *pvVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  Vec_Vec_t *pVVar5;
  void **ppvVar6;
  undefined8 *puVar7;
  void **ppvVar8;
  void *pvVar9;
  uint uVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  
  iVar3 = Nwk_ManVerifyLevel(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Nwk_ManVerifyLevel(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                  ,0x112,"Vec_Vec_t *Nwk_ManLevelize(Nwk_Man_t *)");
  }
  uVar4 = Nwk_ManLevelMax(pNtk);
  uVar12 = uVar4 + 1;
  pVVar5 = (Vec_Vec_t *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar4) {
    uVar10 = uVar12;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = uVar10;
  if (uVar10 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)(int)uVar10 << 3);
  }
  pVVar5->pArray = ppvVar6;
  if (-1 < (int)uVar4) {
    uVar16 = 0;
    do {
      puVar7 = (undefined8 *)malloc(0x10);
      *puVar7 = 0;
      puVar7[1] = 0;
      ppvVar6[uVar16] = puVar7;
      uVar16 = uVar16 + 1;
    } while (uVar12 != uVar16);
  }
  pVVar5->nSize = uVar12;
  pVVar11 = pNtk->vObjs;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      pvVar1 = pVVar11->pArray[lVar14];
      if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x20) & 7) == 3)) {
        uVar10 = *(uint *)((long)pvVar1 + 0x2c);
        if ((int)uVar4 < (int)uVar10) {
          __assert_fail("Nwk_ObjLevel(pObj) <= nLevels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                        ,0x117,"Vec_Vec_t *Nwk_ManLevelize(Nwk_Man_t *)");
        }
        iVar3 = pVVar5->nSize;
        if (iVar3 <= (int)uVar10) {
          iVar15 = uVar10 + 1;
          if (pVVar5->nCap <= (int)uVar10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((long)iVar15 << 3);
            }
            else {
              ppvVar8 = (void **)realloc(pVVar5->pArray,(long)iVar15 << 3);
            }
            pVVar5->pArray = ppvVar8;
            pVVar5->nCap = iVar15;
          }
          lVar13 = 0;
          do {
            puVar7 = (undefined8 *)malloc(0x10);
            *puVar7 = 0;
            puVar7[1] = 0;
            ppvVar6[iVar3 + lVar13] = puVar7;
            lVar13 = lVar13 + 1;
          } while ((uVar10 - iVar3) + 1 != (int)lVar13);
          pVVar5->nSize = iVar15;
        }
        if (((int)uVar10 < 0) || (pVVar5->nSize <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        puVar2 = (uint *)ppvVar6[uVar10];
        uVar10 = *puVar2;
        if (puVar2[1] == uVar10) {
          if ((int)uVar10 < 0x10) {
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar9 = malloc(0x80);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar2 + 2),0x80);
            }
            *(void **)(puVar2 + 2) = pvVar9;
            uVar12 = 0x10;
          }
          else {
            uVar12 = uVar10 * 2;
            if ((int)uVar12 <= (int)uVar10) goto LAB_008dc6b7;
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar9 = malloc((ulong)uVar10 << 4);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar2 + 2),(ulong)uVar10 << 4);
            }
            *(void **)(puVar2 + 2) = pvVar9;
          }
          *puVar2 = uVar12;
        }
LAB_008dc6b7:
        uVar10 = puVar2[1];
        puVar2[1] = uVar10 + 1;
        *(void **)(*(long *)(puVar2 + 2) + (long)(int)uVar10 * 8) = pvVar1;
      }
      lVar14 = lVar14 + 1;
      pVVar11 = pNtk->vObjs;
    } while (lVar14 < pVVar11->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Vec_t * Nwk_ManLevelize( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    assert( Nwk_ManVerifyLevel(pNtk) );
    nLevels = Nwk_ManLevelMax( pNtk );
    vLevels = Vec_VecStart( nLevels + 1 );
    Nwk_ManForEachNode( pNtk, pObj, i )
    {
        assert( Nwk_ObjLevel(pObj) <= nLevels );
        Vec_VecPush( vLevels, Nwk_ObjLevel(pObj), pObj );
    }
    return vLevels;
}